

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool_scheduler.cpp
# Opt level: O2

void async::detail::thread_task_loop
               (threadpool_data *impl,size_t thread_id,task_wait_handle wait_task)

{
  __int_type _Var1;
  task_wait_event **pptVar2;
  task_wait_event *ptVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  size_t i;
  long lVar8;
  __int_type _Var9;
  int iVar10;
  task_run_handle tVar11;
  EVP_PKEY_CTX *ctx;
  task_run_handle t_1;
  allocator_type local_d1;
  task_run_handle t;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_c8;
  task_wait_event event;
  
  event.event_mask = 0;
  event.initialized = false;
  bVar4 = false;
LAB_00104b58:
  do {
    if (wait_task.handle != (task_base *)0x0) {
      if (bVar4) {
        bVar5 = task_wait_event::try_wait(&event,1);
        if (bVar5) goto LAB_00104e1b;
      }
      else if ((byte)(((wait_task.handle)->state)._M_i - completed) < 2) goto LAB_00104e1b;
    }
    work_steal_queue::pop((work_steal_queue *)&t);
    if (t.handle.p != (task_base *)0x0) {
      task_run_handle::run(&t);
      task_run_handle::~task_run_handle(&t);
      goto LAB_00104b58;
    }
    task_run_handle::~task_run_handle(&t);
    do {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&t,
                 (impl->thread_data).length,&local_d1);
      lVar8 = 0;
      for (lVar7 = 0; (unsigned_long *)((long)t.handle.p + lVar7) != local_c8._M_current;
          lVar7 = lVar7 + 8) {
        *(long *)((long)t.handle.p + lVar8 * 8) = lVar8;
        lVar8 = lVar8 + 1;
      }
      std::
      shuffle<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>&>
                ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )t.handle.p,local_c8,&(impl->thread_data).ptr[thread_id].rng);
      for (tVar11 = t; tVar11.handle.p != (task_ptr)local_c8._M_current;
          tVar11.handle.p = (task_ptr)&((task_base *)tVar11.handle.p)->state) {
        if ((((task_base *)tVar11.handle.p)->
            super_ref_count_base<async::detail::task_base,_async::detail::task_base_deleter>).
            ref_count.super___atomic_base<unsigned_long>._M_i != thread_id) {
          work_steal_queue::steal((work_steal_queue *)&t_1);
          if (t_1.handle.p != (task_base *)0x0) goto LAB_00104c56;
          task_run_handle::~task_run_handle(&t_1);
        }
      }
      t_1.handle.p = (task_ptr)(task_base *)0x0;
LAB_00104c56:
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&t);
      if (t_1.handle.p != (task_base *)0x0) {
        task_run_handle::run(&t_1);
        task_run_handle::~task_run_handle(&t_1);
        goto LAB_00104b58;
      }
      task_run_handle::~task_run_handle(&t_1);
      std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&t,&impl->lock);
      ctx = (EVP_PKEY_CTX *)&impl->public_queue;
      fifo_queue::pop((fifo_queue *)&t_1);
      tVar11 = t_1;
      if (t_1.handle.p == (task_base *)0x0) {
        iVar10 = 0;
      }
      else {
        std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&t);
        task_run_handle::run(&t_1);
        iVar10 = 5;
      }
      task_run_handle::~task_run_handle(&t_1);
      if (tVar11.handle.p == (task_base *)0x0) {
        if (wait_task.handle == (task_base *)0x0) {
          if (impl->shutdown == false) {
            task_wait_event::init(&event,ctx);
            goto LAB_00104d4d;
          }
        }
        else {
          task_wait_event::init(&event,ctx);
          if (!bVar4) {
            t_1.handle.p = (task_ptr)task_base::operator_new(0x40);
            (((task_base *)t_1.handle.p)->
            super_ref_count_base<async::detail::task_base,_async::detail::task_base_deleter>).
            ref_count.super___atomic_base<unsigned_long>._M_i = 1;
            (((task_base *)t_1.handle.p)->state)._M_i = pending;
            (((task_base *)t_1.handle.p)->continuations).atomic_data._M_i.data = 0;
            ((task_base *)t_1.handle.p)->vtable =
                 (task_base_vtable *)
                 task_func<async::detail::inline_scheduler_impl,async::task_wait_handle::wait_exec_func<async::detail::thread_task_loop(async::detail::threadpool_data*,unsigned_long,async::task_wait_handle)::$_0>,async::detail::fake_void>
                 ::vtable_impl;
            *(task_wait_event **)&((task_base *)t_1.handle.p)->field_0x28 = &event;
            ctx = (EVP_PKEY_CTX *)&inline_scheduler()::instance;
            *(undefined1 **)&((task_base *)t_1.handle.p)->field_0x20 = &inline_scheduler()::instance
            ;
            task_base::add_continuation<async::detail::inline_scheduler_impl>
                      (wait_task.handle,(inline_scheduler_impl *)&inline_scheduler()::instance,
                       (task_ptr *)&t_1);
            ref_count_ptr<async::detail::task_base>::~ref_count_ptr
                      ((ref_count_ptr<async::detail::task_base> *)&t_1);
            bVar4 = true;
          }
LAB_00104d4d:
          _Var1 = (impl->num_waiters).super___atomic_base<unsigned_long>._M_i;
          (impl->waiters)._M_t.
          super___uniq_ptr_impl<async::detail::task_wait_event_*,_std::default_delete<async::detail::task_wait_event_*[]>_>
          ._M_t.
          super__Tuple_impl<0UL,_async::detail::task_wait_event_**,_std::default_delete<async::detail::task_wait_event_*[]>_>
          .super__Head_base<0UL,_async::detail::task_wait_event_**,_false>._M_head_impl[_Var1] =
               &event;
          (impl->num_waiters).super___atomic_base<unsigned_long>._M_i = _Var1 + 1;
          std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&t);
          uVar6 = task_wait_event::wait(&event,ctx);
          std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&t);
          _Var1 = (impl->num_waiters).super___atomic_base<unsigned_long>._M_i;
          for (_Var9 = 0; _Var1 != _Var9; _Var9 = _Var9 + 1) {
            pptVar2 = (impl->waiters)._M_t.
                      super___uniq_ptr_impl<async::detail::task_wait_event_*,_std::default_delete<async::detail::task_wait_event_*[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_async::detail::task_wait_event_**,_std::default_delete<async::detail::task_wait_event_*[]>_>
                      .super__Head_base<0UL,_async::detail::task_wait_event_**,_false>._M_head_impl;
            ptVar3 = pptVar2[_Var9];
            if (ptVar3 == &event) {
              if (_Var1 - 1 != _Var9) {
                pptVar2[_Var9] = pptVar2[_Var1 - 1];
                pptVar2[_Var1 - 1] = ptVar3;
              }
              (impl->num_waiters).super___atomic_base<unsigned_long>._M_i = _Var1 - 1;
              break;
            }
          }
          iVar10 = 0;
          if ((wait_task.handle == (task_base *)0x0) || (iVar10 = 0, (uVar6 & 1) == 0))
          goto LAB_00104dcf;
        }
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&t);
        goto LAB_00104e1b;
      }
LAB_00104dcf:
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&t);
    } while (iVar10 == 0);
    if (iVar10 != 5) {
LAB_00104e1b:
      task_wait_event::~task_wait_event(&event);
      return;
    }
  } while( true );
}

Assistant:

static void thread_task_loop(threadpool_data* impl, std::size_t thread_id, task_wait_handle wait_task)
{
	// Get our thread's data
	thread_data_t& current_thread = impl->thread_data[thread_id];

	// Flag indicating if we have added a continuation to the task
	bool added_continuation = false;

	// Event to wait on
	task_wait_event event;

	// Loop while waiting for the task to complete
	while (true) {
		// Check if the task has finished. If we have added a continuation, we
		// need to make sure the event has been signaled, otherwise the other
		// thread may try to signal it after we have freed it.
		if (wait_task && (added_continuation ? event.try_wait(wait_type::task_finished) : wait_task.ready()))
			return;

		// Try to get a task from the local queue
		if (task_run_handle t = current_thread.queue.pop()) {
			t.run();
			continue;
		}

		// Stealing loop
		while (true) {
			// Try to steal a task
			if (task_run_handle t = steal_task(impl, thread_id)) {
				t.run();
				break;
			}

			// Try to fetch from the public queue
			std::unique_lock<std::mutex> locked(impl->lock);
			if (task_run_handle t = impl->public_queue.pop()) {
				// Don't hold the lock while running the task
				locked.unlock();
				t.run();
				break;
			}

			// If shutting down and we don't have a task to wait for, return.
			if (!wait_task && impl->shutdown) {
#ifdef BROKEN_JOIN_IN_DESTRUCTOR
				// Notify once all worker threads have exited
				if (--impl->shutdown_num_threads == 0)
					impl->shutdown_complete_event.notify_one();
#endif
				return;
			}

			// Initialize the event object
			event.init();

			// No tasks found, so sleep until something happens.
			// If a continuation has not been added yet, add it.
			if (wait_task && !added_continuation) {
				// Create a continuation for the task we are waiting for
				wait_task.on_finish([&event] {
					// Signal the thread's event
					event.signal(wait_type::task_finished);
				});
				added_continuation = true;
			}

			// Add our thread to the list of waiting threads
			size_t num_waiters_val = impl->num_waiters.load(std::memory_order_relaxed);
			impl->waiters[num_waiters_val] = &event;
			impl->num_waiters.store(num_waiters_val + 1, std::memory_order_relaxed);

			// Wait for our event to be signaled when a task is scheduled or
			// the task we are waiting for has completed.
			locked.unlock();
			int events = event.wait();
			locked.lock();

			// Remove our thread from the list of waiting threads
			num_waiters_val = impl->num_waiters.load(std::memory_order_relaxed);
			for (std::size_t i = 0; i < num_waiters_val; i++) {
				if (impl->waiters[i] == &event) {
					if (i != num_waiters_val - 1)
						std::swap(impl->waiters[i], impl->waiters[num_waiters_val - 1]);
					impl->num_waiters.store(num_waiters_val - 1, std::memory_order_relaxed);
					break;
				}
			}

			// Check again if the task has finished. We have added a
			// continuation at this point, so we need to check that the
			// continuation has finished signaling the event.
			if (wait_task && (events & wait_type::task_finished))
				return;
		}
	}
}